

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O1

Expression *
slang::ast::ReplicationExpression::fromSyntax
          (Compilation *compilation,MultipleConcatenationExpressionSyntax *syntax,
          ASTContext *context)

{
  bool bVar1;
  Type *pTVar2;
  Expression *args_2;
  Type *expr;
  SourceLocation location;
  Diagnostic *diag;
  Diagnostic *diag_00;
  optional<int> value;
  optional<unsigned_int> oVar3;
  Type *pTVar4;
  uint uVar5;
  _Storage<int,_true> _Var6;
  Type *context_00;
  SourceRange SVar7;
  Expression *right;
  ConstantValue leftVal;
  EvalContext evalCtx;
  undefined1 in_stack_fffffffffffffc0c [12];
  Expression *local_3e0;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_3d8;
  uint uStack_3d0;
  undefined1 uStack_3cc;
  byte bStack_3cb;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_3c8;
  uint local_3c0;
  ushort local_3bc;
  Type *local_3b8;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_3b0;
  char local_390;
  undefined1 local_388 [88];
  size_type local_330;
  size_type local_328;
  undefined1 local_320 [160];
  pointer local_280;
  size_type local_278;
  size_type local_270;
  Token local_268 [2];
  pointer local_240;
  size_type local_238;
  size_type local_230;
  undefined1 local_228 [224];
  pointer local_148;
  size_type local_140;
  size_type local_138;
  undefined1 local_130 [224];
  SourceLocation local_50;
  SourceLocation SStack_48;
  bool local_40;
  
  pTVar2 = (Type *)Expression::selfDetermined
                             (compilation,(syntax->expression).ptr,context,
                              (bitmask<slang::ast::ASTFlags>)0x0);
  args_2 = Expression::create(compilation,(ExpressionSyntax *)(syntax->concatenation).ptr,context,
                              (bitmask<slang::ast::ASTFlags>)0x0,(Type *)0x0);
  pTVar4 = compilation->errorType;
  local_3e0 = args_2;
  local_388._0_16_ = (undefined1  [16])slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  expr = (Type *)BumpAllocator::
                 emplace<slang::ast::ReplicationExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange>
                           (&compilation->super_BumpAllocator,pTVar4,(Expression *)pTVar2,args_2,
                            (SourceRange *)local_388);
  bVar1 = Expression::bad((Expression *)pTVar2);
  if ((bVar1) || (bVar1 = Expression::bad(local_3e0), bVar1)) goto LAB_00437cdd;
  bVar1 = Type::isIntegral((Type *)(pTVar2->super_Symbol).name._M_len);
  if (!bVar1) {
LAB_00437c6d:
    local_388._0_16_ =
         (undefined1  [16])
         slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)(syntax->concatenation).ptr);
    location = parsing::Token::location((Token *)local_388);
    diag = ASTContext::addDiag(context,(DiagCode)0x260007,location);
    diag_00 = ast::operator<<(diag,(Type *)(pTVar2->super_Symbol).name._M_len);
    ast::operator<<(diag_00,(local_3e0->type).ptr);
    Diagnostic::operator<<(diag,*(SourceRange *)&(pTVar2->super_Symbol).parentScope);
    Diagnostic::operator<<(diag,local_3e0->sourceRange);
LAB_00437cdd:
    pTVar4 = (Type *)Expression::badExpr(compilation,(Expression *)expr);
    return (Expression *)pTVar4;
  }
  bVar1 = Type::isIntegral((local_3e0->type).ptr);
  if (!bVar1) {
    pTVar4 = (local_3e0->type).ptr;
    if (pTVar4->canonical == (Type *)0x0) {
      Type::resolveCanonical(pTVar4);
    }
    if ((pTVar4->canonical->super_Symbol).kind != StringType) goto LAB_00437c6d;
  }
  local_388._48_8_ = context->assertionInstance;
  local_388._80_8_ = local_320;
  local_388._0_16_ = *(undefined1 (*) [16])context;
  local_388._16_8_ = (context->flags).m_bits;
  local_388._24_8_ = context->instanceOrProc;
  local_388._32_8_ = context->firstTempVar;
  local_388._40_8_ = context->randomizeDetails;
  local_388[0x38] = '\x02';
  local_388._60_8_ = 0;
  local_388._68_8_ = 0;
  local_388._76_4_ = 0;
  local_330 = 0;
  local_328 = 2;
  local_280 = (pointer)local_268;
  local_278 = 0;
  local_270 = 5;
  local_240 = (pointer)local_228;
  local_238 = 0;
  local_230 = 2;
  local_148 = (pointer)local_130;
  local_140 = 0;
  local_138 = 2;
  local_50 = (SourceLocation)0x0;
  SStack_48 = (SourceLocation)0x0;
  local_40 = false;
  context_00 = pTVar2;
  local_3b8 = expr;
  Expression::eval((ConstantValue *)&local_3b0,(Expression *)pTVar2,(EvalContext *)local_388);
  if (local_390 == '\0') {
    bVar1 = Expression::isImplicitString(local_3e0);
    pTVar4 = local_3b8;
    if (bVar1) {
      context_00 = (Type *)&local_3e0;
      SVar7._4_12_ = in_stack_fffffffffffffc0c;
      SVar7.startLoc._0_4_ = 1;
      Expression::contextDetermined
                ((Expression *)context,(ASTContext *)context_00,(Expression **)local_3b8,
                 (Expression *)compilation->stringType,(Type *)0x0,SVar7,Implicit);
      (pTVar4->super_Symbol).originatingSyntax = (SyntaxNode *)local_3e0;
      (pTVar4->super_Symbol).name._M_len = (size_t)compilation->stringType;
    }
    else {
      EvalContext::reportAllDiags((EvalContext *)local_388);
      context_00 = pTVar4;
      pTVar4 = (Type *)Expression::badExpr(compilation,(Expression *)pTVar4);
    }
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       *)&local_3b0);
  if (local_390 == '\0') goto LAB_00437f1c;
  context_00 = pTVar2;
  value = ASTContext::evalInteger(context,(Expression *)pTVar2,(bitmask<slang::ast::EvalFlags>)0x0);
  pTVar4 = local_3b8;
  if (((ulong)value.super__Optional_base<int,_true,_true>._M_payload.
              super__Optional_payload_base<int> >> 0x20 & 1) != 0) {
    _Var6._M_value =
         value.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
         _M_payload;
    if (-1 < _Var6._M_value) {
      if (_Var6._M_value == 0) {
        if (((context->flags).m_bits & 1) == 0) {
          ASTContext::addDiag(context,(DiagCode)0x930007,
                              *(SourceRange *)&(pTVar2->super_Symbol).parentScope);
          goto LAB_00437dc5;
        }
        pTVar2 = compilation->voidType;
      }
      else {
        context_00 = (Type *)&local_3e0;
        Expression::selfDetermined(context,(Expression **)context_00);
        (pTVar4->super_Symbol).originatingSyntax = (SyntaxNode *)local_3e0;
        pTVar2 = (local_3e0->type).ptr;
        if (pTVar2->canonical == (Type *)0x0) {
          Type::resolveCanonical(pTVar2);
        }
        if ((pTVar2->canonical->super_Symbol).kind == StringType) {
          pTVar2 = compilation->stringType;
        }
        else {
          local_3c8._0_4_ = _Var6._M_value & 0x7fffffff;
          local_3c8.val._4_4_ = 0;
          local_3c0 = 0x20;
          local_3bc = 1;
          SVInt::clearUnusedBits((SVInt *)&local_3c8);
          local_3d8.val._0_4_ = Type::getBitWidth((local_3e0->type).ptr);
          uStack_3cc = 0;
          bStack_3cb = 0;
          local_3d8.val._4_2_ = 0;
          local_3d8.val._6_2_ = 0;
          uVar5 = 0x20;
          if (local_3d8.val._0_4_ != 0) {
            uVar5 = 0x1f;
            if (local_3d8.val._0_4_ != 0) {
              for (; (uint)local_3d8.val._0_4_ >> uVar5 == 0; uVar5 = uVar5 - 1) {
              }
            }
            uVar5 = uVar5 ^ 0x1f;
          }
          uStack_3d0 = 1;
          if (local_3d8.val._0_4_ != 0) {
            uStack_3d0 = 0x20 - uVar5;
          }
          SVInt::clearUnusedBits((SVInt *)&local_3d8);
          SVInt::operator*((SVInt *)&local_3b0,(SVInt *)&local_3c8);
          SVar7 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
          oVar3 = ASTContext::requireValidBitWidth(context,(SVInt *)&local_3b0,SVar7);
          if (((0x40 < (uint)local_3b0._8_4_) || ((local_3b0._13_1_ & 1) != 0)) &&
             ((void *)local_3b0._0_8_ != (void *)0x0)) {
            operator_delete__((void *)local_3b0._0_8_);
          }
          if (((0x40 < uStack_3d0) || ((bStack_3cb & 1) != 0)) &&
             ((void *)CONCAT26(local_3d8.val._6_2_,local_3d8.val._0_6_) != (void *)0x0)) {
            operator_delete__((void *)CONCAT26(local_3d8.val._6_2_,local_3d8.val._0_6_));
          }
          if (((0x40 < local_3c0) || ((local_3bc & 0x100) != 0)) &&
             ((SourceLocation)local_3c8.val != (SourceLocation)0x0)) {
            operator_delete__(local_3c8.pVal);
          }
          if (((ulong)oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_int> & 0x100000000) == 0) {
            context_00 = pTVar4;
            pTVar4 = (Type *)Expression::badExpr(compilation,(Expression *)pTVar4);
            goto LAB_00437f1c;
          }
          bVar1 = Type::isFourState((local_3e0->type).ptr);
          context_00 = (Type *)((ulong)oVar3.super__Optional_base<unsigned_int,_true,_true>.
                                       _M_payload.super__Optional_payload_base<unsigned_int> &
                               0xffffffff);
          pTVar2 = Compilation::getType
                             (compilation,
                              oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                              super__Optional_payload_base<unsigned_int>._M_payload,
                              (bitmask<slang::ast::IntegralFlags>)(bVar1 * '\x02'));
        }
      }
      (pTVar4->super_Symbol).name._M_len = (size_t)pTVar2;
      goto LAB_00437f1c;
    }
    ASTContext::requireGtZero(context,value,*(SourceRange *)&(pTVar2->super_Symbol).parentScope);
  }
LAB_00437dc5:
  context_00 = pTVar4;
  pTVar4 = (Type *)Expression::badExpr(compilation,(Expression *)pTVar4);
LAB_00437f1c:
  SmallVectorBase<slang::Diagnostic>::cleanup
            ((SmallVectorBase<slang::Diagnostic> *)&local_148,(EVP_PKEY_CTX *)context_00);
  SmallVectorBase<slang::Diagnostic>::cleanup
            ((SmallVectorBase<slang::Diagnostic> *)&local_240,(EVP_PKEY_CTX *)context_00);
  if ((Token *)local_280 != local_268) {
    operator_delete(local_280);
  }
  SmallVectorBase<slang::ast::EvalContext::Frame>::cleanup
            ((SmallVectorBase<slang::ast::EvalContext::Frame> *)(local_388 + 0x50),
             (EVP_PKEY_CTX *)context_00);
  return (Expression *)pTVar4;
}

Assistant:

Expression& ReplicationExpression::fromSyntax(Compilation& compilation,
                                              const MultipleConcatenationExpressionSyntax& syntax,
                                              const ASTContext& context) {
    Expression& left = selfDetermined(compilation, *syntax.expression, context);
    Expression* right = &create(compilation, *syntax.concatenation, context);

    auto result = compilation.emplace<ReplicationExpression>(compilation.getErrorType(), left,
                                                             *right, syntax.sourceRange());
    if (left.bad() || right->bad())
        return badExpr(compilation, result);

    if (!left.type->isIntegral() || (!right->type->isIntegral() && !right->type->isString())) {
        auto& diag = context.addDiag(diag::BadReplicationExpression,
                                     syntax.concatenation->getFirstToken().location());
        diag << *left.type << *right->type;
        diag << left.sourceRange;
        diag << right->sourceRange;
        return badExpr(compilation, result);
    }

    // If the multiplier isn't constant this must be a string replication.
    EvalContext evalCtx(context, EvalFlags::CacheResults);
    if (ConstantValue leftVal = left.eval(evalCtx); !leftVal) {
        if (!right->isImplicitString()) {
            // They probably meant for this to be a constant (non-string) replication,
            // so do the normal error reporting for that case.
            evalCtx.reportAllDiags();
            return badExpr(compilation, result);
        }

        contextDetermined(context, right, result, compilation.getStringType(), {});

        result->concat_ = right;
        result->type = &compilation.getStringType();
        return *result;
    }

    std::optional<int32_t> count = context.evalInteger(left);
    if (!count)
        return badExpr(compilation, result);

    if (*count < 0) {
        context.requireGtZero(count, left.sourceRange);
        return badExpr(compilation, result);
    }

    if (*count == 0) {
        if (!context.flags.has(ASTFlags::InsideConcatenation)) {
            context.addDiag(diag::ReplicationZeroOutsideConcat, left.sourceRange);
            return badExpr(compilation, result);
        }

        // Use a placeholder type here to indicate to the parent concatenation that this had a
        // zero width.
        result->type = &compilation.getVoidType();
        return *result;
    }

    selfDetermined(context, right);
    result->concat_ = right;

    if (right->type->isString()) {
        result->type = &compilation.getStringType();
        return *result;
    }

    auto width = context.requireValidBitWidth(
        SVInt(32, uint64_t(*count), true) * right->type->getBitWidth(), syntax.sourceRange());
    if (!width)
        return badExpr(compilation, result);

    result->type = &compilation.getType(*width, right->type->isFourState()
                                                    ? IntegralFlags::FourState
                                                    : IntegralFlags::TwoState);
    return *result;
}